

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# j2k.c
# Opt level: O0

OPJ_BOOL opj_j2k_decode_tiles
                   (opj_j2k_t *p_j2k,opj_stream_private_t *p_stream,opj_event_mgr_t *p_manager)

{
  OPJ_BOOL OVar1;
  OPJ_OFF_T OVar2;
  uint local_5c;
  int local_58;
  OPJ_UINT32 i;
  OPJ_UINT32 nr_tiles;
  OPJ_UINT32 l_nb_comps;
  OPJ_INT32 l_tile_y1;
  OPJ_INT32 l_tile_x1;
  OPJ_INT32 l_tile_y0;
  OPJ_INT32 l_tile_x0;
  OPJ_UINT32 l_current_tile_no;
  OPJ_BOOL l_go_on;
  opj_event_mgr_t *p_manager_local;
  opj_stream_private_t *p_stream_local;
  opj_j2k_t *p_j2k_local;
  
  l_tile_x0 = 1;
  local_58 = 0;
  _l_current_tile_no = p_manager;
  p_manager_local = (opj_event_mgr_t *)p_stream;
  p_stream_local = (opj_stream_private_t *)p_j2k;
  if ((((((p_j2k->m_cp).tw == 1) && ((p_j2k->m_cp).th == 1)) && ((p_j2k->m_cp).tx0 == 0)) &&
      (((p_j2k->m_cp).ty0 == 0 && (p_j2k->m_output_image->x0 == 0)))) &&
     ((p_j2k->m_output_image->y0 == 0 &&
      ((p_j2k->m_output_image->x1 == (p_j2k->m_cp).tdx &&
       (p_j2k->m_output_image->y1 == (p_j2k->m_cp).tdy)))))) {
    OVar1 = opj_j2k_read_tile_header
                      (p_j2k,(OPJ_UINT32 *)&l_tile_y0,(OPJ_UINT32 *)0x0,&l_tile_x1,&l_tile_y1,
                       (OPJ_INT32 *)&l_nb_comps,(OPJ_INT32 *)&nr_tiles,&i,&l_tile_x0,p_stream,
                       p_manager);
    if (OVar1 == 0) {
      p_j2k_local._4_4_ = 0;
    }
    else {
      OVar1 = opj_j2k_decode_tile((opj_j2k_t *)p_stream_local,l_tile_y0,(OPJ_BYTE *)0x0,0,
                                  (opj_stream_private_t *)p_manager_local,_l_current_tile_no);
      if (OVar1 == 0) {
        opj_event_msg(_l_current_tile_no,1,"Failed to decode tile 1/1\n");
        p_j2k_local._4_4_ = 0;
      }
      else {
        for (local_5c = 0; local_5c < *(uint *)(p_stream_local->m_buffer_size + 0x10);
            local_5c = local_5c + 1) {
          opj_image_data_free(*(void **)(*(long *)(p_stream_local->m_buffer_size + 0x18) +
                                         (ulong)local_5c * 0x40 + 0x30));
          *(undefined8 *)
           (*(long *)(p_stream_local->m_buffer_size + 0x18) + (ulong)local_5c * 0x40 + 0x30) =
               *(undefined8 *)
                (*(long *)(**(long **)(p_stream_local[2].m_stored_data + 0x18) + 0x18) +
                 (ulong)local_5c * 0x70 + 0x30);
          *(undefined4 *)
           (*(long *)(p_stream_local->m_buffer_size + 0x18) + (ulong)local_5c * 0x40 + 0x24) =
               *(undefined4 *)
                (*(long *)(*(long *)(p_stream_local[2].m_stored_data + 0x20) + 0x18) +
                 (ulong)local_5c * 0x40 + 0x24);
          *(undefined8 *)
           (*(long *)(**(long **)(p_stream_local[2].m_stored_data + 0x18) + 0x18) +
            (ulong)local_5c * 0x70 + 0x30) = 0;
        }
        p_j2k_local._4_4_ = 1;
      }
    }
    return p_j2k_local._4_4_;
  }
  while( true ) {
    if (((*(int *)&p_stream_local[1].m_read_fn == 1) &&
        (*(int *)((long)&p_stream_local[1].m_read_fn + 4) == 1)) &&
       (*(long *)(p_stream_local[1].m_buffer_size + 0x15f0) != 0)) {
      l_tile_y0 = 0;
      *(undefined4 *)&p_stream_local[2].m_seek_fn = 0;
      *(uint *)&p_stream_local->m_free_user_data_fn =
           *(uint *)&p_stream_local->m_free_user_data_fn | 0x80;
    }
    else {
      OVar1 = opj_j2k_read_tile_header
                        ((opj_j2k_t *)p_stream_local,(OPJ_UINT32 *)&l_tile_y0,(OPJ_UINT32 *)0x0,
                         &l_tile_x1,&l_tile_y1,(OPJ_INT32 *)&l_nb_comps,(OPJ_INT32 *)&nr_tiles,&i,
                         &l_tile_x0,(opj_stream_private_t *)p_manager_local,_l_current_tile_no);
      if (OVar1 == 0) {
        return 0;
      }
      if (l_tile_x0 == 0) {
        return 1;
      }
    }
    OVar1 = opj_j2k_decode_tile((opj_j2k_t *)p_stream_local,l_tile_y0,(OPJ_BYTE *)0x0,0,
                                (opj_stream_private_t *)p_manager_local,_l_current_tile_no);
    if (OVar1 == 0) {
      opj_event_msg(_l_current_tile_no,1,"Failed to decode tile %d/%d\n",(ulong)(l_tile_y0 + 1),
                    (ulong)(uint)(*(int *)((long)&p_stream_local[1].m_read_fn + 4) *
                                 *(int *)&p_stream_local[1].m_read_fn));
      return 0;
    }
    opj_event_msg(_l_current_tile_no,4,"Tile %d/%d has been decoded.\n",(ulong)(l_tile_y0 + 1),
                  (ulong)(uint)(*(int *)((long)&p_stream_local[1].m_read_fn + 4) *
                               *(int *)&p_stream_local[1].m_read_fn));
    OVar1 = opj_j2k_update_image_data
                      ((opj_tcd_t *)p_stream_local[2].m_stored_data,
                       (opj_image_t *)p_stream_local->m_buffer_size);
    if (OVar1 == 0) break;
    if (((*(int *)&p_stream_local[1].m_read_fn != 1) ||
        (*(int *)((long)&p_stream_local[1].m_read_fn + 4) != 1)) ||
       (((*(int *)p_stream_local->m_buffer_size == *(int *)p_stream_local->m_byte_offset &&
         ((*(int *)(p_stream_local->m_buffer_size + 4) ==
           *(int *)(p_stream_local->m_byte_offset + 4) &&
          (*(int *)(p_stream_local->m_buffer_size + 8) ==
           *(int *)(p_stream_local->m_byte_offset + 8))))) &&
        (*(int *)(p_stream_local->m_buffer_size + 0xc) ==
         *(int *)(p_stream_local->m_byte_offset + 0xc))))) {
      opj_j2k_tcp_data_destroy
                ((opj_tcp_t *)(p_stream_local[1].m_buffer_size + (ulong)(uint)l_tile_y0 * 0x1640));
    }
    opj_event_msg(_l_current_tile_no,4,"Image data has been updated with tile %d.\n\n",
                  (ulong)(l_tile_y0 + 1));
    OVar2 = opj_stream_get_number_byte_left((opj_stream_private_t *)p_manager_local);
    if ((OVar2 == 0) && (*(int *)&p_stream_local->m_free_user_data_fn == 0x40)) {
      return 1;
    }
    local_58 = local_58 + 1;
    if (local_58 ==
        *(int *)((long)&p_stream_local[1].m_read_fn + 4) * *(int *)&p_stream_local[1].m_read_fn) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static OPJ_BOOL opj_j2k_decode_tiles(opj_j2k_t *p_j2k,
                                     opj_stream_private_t *p_stream,
                                     opj_event_mgr_t * p_manager)
{
    OPJ_BOOL l_go_on = OPJ_TRUE;
    OPJ_UINT32 l_current_tile_no;
    OPJ_INT32 l_tile_x0, l_tile_y0, l_tile_x1, l_tile_y1;
    OPJ_UINT32 l_nb_comps;
    OPJ_UINT32 nr_tiles = 0;

    /* Particular case for whole single tile decoding */
    /* We can avoid allocating intermediate tile buffers */
    if (p_j2k->m_cp.tw == 1 && p_j2k->m_cp.th == 1 &&
            p_j2k->m_cp.tx0 == 0 && p_j2k->m_cp.ty0 == 0 &&
            p_j2k->m_output_image->x0 == 0 &&
            p_j2k->m_output_image->y0 == 0 &&
            p_j2k->m_output_image->x1 == p_j2k->m_cp.tdx &&
            p_j2k->m_output_image->y1 == p_j2k->m_cp.tdy) {
        OPJ_UINT32 i;
        if (! opj_j2k_read_tile_header(p_j2k,
                                       &l_current_tile_no,
                                       NULL,
                                       &l_tile_x0, &l_tile_y0,
                                       &l_tile_x1, &l_tile_y1,
                                       &l_nb_comps,
                                       &l_go_on,
                                       p_stream,
                                       p_manager)) {
            return OPJ_FALSE;
        }

        if (! opj_j2k_decode_tile(p_j2k, l_current_tile_no, NULL, 0,
                                  p_stream, p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR, "Failed to decode tile 1/1\n");
            return OPJ_FALSE;
        }

        /* Transfer TCD data to output image data */
        for (i = 0; i < p_j2k->m_output_image->numcomps; i++) {
            opj_image_data_free(p_j2k->m_output_image->comps[i].data);
            p_j2k->m_output_image->comps[i].data =
                p_j2k->m_tcd->tcd_image->tiles->comps[i].data;
            p_j2k->m_output_image->comps[i].resno_decoded =
                p_j2k->m_tcd->image->comps[i].resno_decoded;
            p_j2k->m_tcd->tcd_image->tiles->comps[i].data = NULL;
        }

        return OPJ_TRUE;
    }

    for (;;) {
        if (p_j2k->m_cp.tw == 1 && p_j2k->m_cp.th == 1 &&
                p_j2k->m_cp.tcps[0].m_data != NULL) {
            l_current_tile_no = 0;
            p_j2k->m_current_tile_number = 0;
            p_j2k->m_specific_param.m_decoder.m_state |= J2K_STATE_DATA;
        } else {
            if (! opj_j2k_read_tile_header(p_j2k,
                                           &l_current_tile_no,
                                           NULL,
                                           &l_tile_x0, &l_tile_y0,
                                           &l_tile_x1, &l_tile_y1,
                                           &l_nb_comps,
                                           &l_go_on,
                                           p_stream,
                                           p_manager)) {
                return OPJ_FALSE;
            }

            if (! l_go_on) {
                break;
            }
        }

        if (! opj_j2k_decode_tile(p_j2k, l_current_tile_no, NULL, 0,
                                  p_stream, p_manager)) {
            opj_event_msg(p_manager, EVT_ERROR, "Failed to decode tile %d/%d\n",
                          l_current_tile_no + 1, p_j2k->m_cp.th * p_j2k->m_cp.tw);
            return OPJ_FALSE;
        }

        opj_event_msg(p_manager, EVT_INFO, "Tile %d/%d has been decoded.\n",
                      l_current_tile_no + 1, p_j2k->m_cp.th * p_j2k->m_cp.tw);

        if (! opj_j2k_update_image_data(p_j2k->m_tcd,
                                        p_j2k->m_output_image)) {
            return OPJ_FALSE;
        }

        if (p_j2k->m_cp.tw == 1 && p_j2k->m_cp.th == 1 &&
                !(p_j2k->m_output_image->x0 == p_j2k->m_private_image->x0 &&
                  p_j2k->m_output_image->y0 == p_j2k->m_private_image->y0 &&
                  p_j2k->m_output_image->x1 == p_j2k->m_private_image->x1 &&
                  p_j2k->m_output_image->y1 == p_j2k->m_private_image->y1)) {
            /* Keep current tcp data */
        } else {
            opj_j2k_tcp_data_destroy(&p_j2k->m_cp.tcps[l_current_tile_no]);
        }

        opj_event_msg(p_manager, EVT_INFO,
                      "Image data has been updated with tile %d.\n\n", l_current_tile_no + 1);

        if (opj_stream_get_number_byte_left(p_stream) == 0
                && p_j2k->m_specific_param.m_decoder.m_state == J2K_STATE_NEOC) {
            break;
        }
        if (++nr_tiles ==  p_j2k->m_cp.th * p_j2k->m_cp.tw) {
            break;
        }
    }

    return OPJ_TRUE;
}